

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O0

void __thiscall
SStringViewInit_Short_Test<(anonymous_namespace)::string_maker<const_char_*>_>::TestBody
          (SStringViewInit_Short_Test<(anonymous_namespace)::string_maker<const_char_*>_> *this)

{
  bool bVar1;
  char *pcVar2;
  size_t length;
  const_iterator __first;
  const_iterator __last;
  char *in_R9;
  AssertHelper local_170;
  Message local_168;
  int local_15c;
  difference_type local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_120;
  Message local_118;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_;
  Message local_f0;
  unsigned_long local_e8;
  size_type local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_2;
  Message local_c0;
  uint local_b4;
  size_type local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  Message local_90;
  uint local_84;
  size_type local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  raw_sstring_view sv;
  char *ptr;
  allocator local_39;
  undefined1 local_38 [8];
  string src;
  TypeParam t;
  SStringViewInit_Short_Test<(anonymous_namespace)::string_maker<const_char_*>_> *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"hello",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar2 = anon_unknown.dwarf_e1429::string_maker<const_char_*>::operator()
                     ((string_maker<const_char_*> *)(src.field_2._M_local_buf + 0xf),
                      (string *)local_38);
  length = std::__cxx11::string::length();
  join_0x00000010_0x00000000_ = pstore::make_sstring_view(pcVar2,length);
  local_80 = pstore::sstring_view<const_char_*>::size
                       ((sstring_view<const_char_*> *)&gtest_ar.message_);
  local_84 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_78,"sv.size ()","5U",&local_80,&local_84);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x72,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  local_b0 = pstore::sstring_view<const_char_*>::length
                       ((sstring_view<const_char_*> *)&gtest_ar.message_);
  local_b4 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_a8,"sv.length ()","5U",&local_b0,&local_b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x73,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_e0 = pstore::sstring_view<const_char_*>::max_size
                       ((sstring_view<const_char_*> *)&gtest_ar.message_);
  local_e8 = std::numeric_limits<unsigned_long>::max();
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_d8,"sv.max_size ()","std::numeric_limits<std::size_t>::max ()",
             &local_e0,&local_e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x74,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  local_109 = pstore::sstring_view<const_char_*>::empty
                        ((sstring_view<const_char_*> *)&gtest_ar.message_);
  local_109 = !local_109;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_108,&local_109,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_108,(AssertionResult *)"sv.empty ()"
               ,"true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x75,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  __first = std::begin<pstore::sstring_view<char_const*>>
                      ((sstring_view<const_char_*> *)&gtest_ar.message_);
  __last = std::end<pstore::sstring_view<char_const*>>
                     ((sstring_view<const_char_*> *)&gtest_ar.message_);
  local_158 = std::distance<char_const*>(__first,__last);
  local_15c = 5;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_150,"std::distance (std::begin (sv), std::end (sv))","5",&local_158,
             &local_15c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

TYPED_TEST (SStringViewInit, Short) {
    using namespace pstore;
    TypeParam t;
    std::string const src{"hello"};
    auto ptr = t (src);
    auto sv = make_sstring_view (std::move (ptr), src.length ());
    EXPECT_EQ (sv.size (), 5U);
    EXPECT_EQ (sv.length (), 5U);
    EXPECT_EQ (sv.max_size (), std::numeric_limits<std::size_t>::max ());
    EXPECT_FALSE (sv.empty ());
    EXPECT_EQ (std::distance (std::begin (sv), std::end (sv)), 5);
}